

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlErrAttributeDup(xmlParserCtxtPtr ctxt,xmlChar *prefix,xmlChar *localname)

{
  xmlChar *str2;
  char *msg;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if ((ctxt->disableSAX != 0) && (ctxt->instate == XML_PARSER_EOF)) {
      return;
    }
    ctxt->errNo = 0x2a;
  }
  if (prefix == (xmlChar *)0x0) {
    msg = "Attribute %s redefined\n";
    str2 = (xmlChar *)0x0;
    prefix = localname;
  }
  else {
    msg = "Attribute %s:%s redefined\n";
    str2 = localname;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,(void *)0x0,
                  1,0x2a,XML_ERR_FATAL,(char *)0x0,0,(char *)prefix,(char *)str2,(char *)0x0,0,0,msg
                  ,prefix);
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->wellFormed = 0, ctxt->recovery == 0)) {
    ctxt->disableSAX = 1;
  }
  return;
}

Assistant:

static void
xmlErrAttributeDup(xmlParserCtxtPtr ctxt, const xmlChar * prefix,
                   const xmlChar * localname)
{
    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL)
	ctxt->errNo = XML_ERR_ATTRIBUTE_REDEFINED;

    if (prefix == NULL)
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER,
                        XML_ERR_ATTRIBUTE_REDEFINED, XML_ERR_FATAL, NULL, 0,
                        (const char *) localname, NULL, NULL, 0, 0,
                        "Attribute %s redefined\n", localname);
    else
        __xmlRaiseError(NULL, NULL, NULL, ctxt, NULL, XML_FROM_PARSER,
                        XML_ERR_ATTRIBUTE_REDEFINED, XML_ERR_FATAL, NULL, 0,
                        (const char *) prefix, (const char *) localname,
                        NULL, 0, 0, "Attribute %s:%s redefined\n", prefix,
                        localname);
    if (ctxt != NULL) {
	ctxt->wellFormed = 0;
	if (ctxt->recovery == 0)
	    ctxt->disableSAX = 1;
    }
}